

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<double,duckdb::hugeint_t,duckdb::ArgMinMaxState<double,duckdb::hugeint_t>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<double,_duckdb::hugeint_t> *state,double x_data,hugeint_t y_data,
          AggregateBinaryInput *binary)

{
  long lVar1;
  uint64_t uVar2;
  ArgMinMaxBase<duckdb::LessThan,false> AVar3;
  
  lVar1 = y_data.upper;
  uVar2 = y_data.lower;
  if ((**(long **)(lVar1 + 0x10) != 0) &&
     ((*(ulong *)(**(long **)(lVar1 + 0x10) + (*(ulong *)(lVar1 + 0x20) >> 6) * 8) >>
       (*(ulong *)(lVar1 + 0x20) & 0x3f) & 1) == 0)) {
    return;
  }
  if (((long)*(uint64_t *)(this + 0x18) <= (long)uVar2) &&
     (*(ArgMinMaxState<double,_duckdb::hugeint_t> **)(this + 0x10) <= state ||
      *(uint64_t *)(this + 0x18) != uVar2)) {
    return;
  }
  if (**(long **)(lVar1 + 8) == 0) {
    this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)0x0;
  }
  else {
    AVar3 = (ArgMinMaxBase<duckdb::LessThan,false>)
            ((*(ulong *)(**(long **)(lVar1 + 8) + (*(ulong *)(lVar1 + 0x18) >> 6) * 8) >>
              (*(ulong *)(lVar1 + 0x18) & 0x3f) & 1) == 0);
    this[1] = AVar3;
    if ((bool)AVar3) goto LAB_01993f94;
  }
  *(double *)(this + 8) = x_data;
LAB_01993f94:
  *(ArgMinMaxState<double,_duckdb::hugeint_t> **)(this + 0x10) = state;
  *(uint64_t *)(this + 0x18) = uVar2;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}